

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

void __thiscall Token::Token(Token *this,ObjectStoreToken *inToken)

{
  undefined1 uVar1;
  int iVar2;
  MutexFactory *this_00;
  Mutex *pMVar3;
  SecureDataManager *this_01;
  ByteString userPINBlob;
  ByteString soPINBlob;
  ByteString local_60;
  ByteString local_38;
  
  this->_vptr_Token = (_func_int **)&PTR__Token_0019ed98;
  this_00 = MutexFactory::i();
  pMVar3 = MutexFactory::getMutex(this_00);
  this->tokenMutex = pMVar3;
  this->token = inToken;
  ByteString::ByteString(&local_38);
  ByteString::ByteString(&local_60);
  iVar2 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&local_38);
  if ((char)iVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar2 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&local_60);
    uVar1 = (undefined1)iVar2;
  }
  this->valid = (bool)uVar1;
  this_01 = (SecureDataManager *)operator_new(0xd0);
  SecureDataManager::SecureDataManager(this_01,&local_38,&local_60);
  this->sdm = this_01;
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_38);
  return;
}

Assistant:

Token::Token(ObjectStoreToken* inToken)
{
	tokenMutex = MutexFactory::i()->getMutex();

	token = inToken;

	ByteString soPINBlob, userPINBlob;

	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	sdm = new SecureDataManager(soPINBlob, userPINBlob);
}